

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_benchmark.cc
# Opt level: O1

void re2::SearchCachedNFA(int iters,char *regexp,StringPiece *text,Anchor anchor,bool expect_match)

{
  bool bVar1;
  size_t sVar2;
  Regexp *this;
  Prog *this_00;
  LogMessage local_1b0;
  
  local_1b0._0_8_ = regexp;
  if (regexp == (char *)0x0) {
    local_1b0._8_4_ = 0;
  }
  else {
    sVar2 = strlen(regexp);
    local_1b0._8_4_ = SUB84(sVar2,0);
  }
  this = Regexp::Parse((StringPiece *)&local_1b0,LikePerl,(RegexpStatus *)0x0);
  if (this == (Regexp *)0x0) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x3d7,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1b0 + 8),"Check failed: re",0x10);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  this_00 = Regexp::CompileToProg(this,0);
  if (this_00 == (Prog *)0x0) {
    LogMessage::LogMessage
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
               ,0x3d9,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)((long)&local_1b0 + 8),"Check failed: prog",0x12);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
  }
  if (0 < iters) {
    do {
      local_1b0._0_8_ = (char *)0x0;
      local_1b0._8_4_ = 0;
      bVar1 = Prog::SearchNFA(this_00,text,(StringPiece *)&local_1b0,anchor,kFirstMatch,
                              (StringPiece *)0x0,0);
      if (bVar1 != expect_match) {
        LogMessage::LogMessage
                  (&local_1b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/regexp_benchmark.cc"
                   ,0x3dc,3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)((long)&local_1b0 + 8),
                   "Check failed: (prog->SearchNFA(text, __null, anchor, Prog::kFirstMatch, __null, 0)) == (expect_match)"
                   ,0x65);
        LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
      }
      iters = iters + -1;
    } while (iters != 0);
  }
  if (this_00 != (Prog *)0x0) {
    Prog::~Prog(this_00);
    operator_delete(this_00);
  }
  Regexp::Decref(this);
  return;
}

Assistant:

void SearchCachedNFA(int iters, const char* regexp, const StringPiece& text,
                     Prog::Anchor anchor, bool expect_match) {
  Regexp* re = Regexp::Parse(regexp, Regexp::LikePerl, NULL);
  CHECK(re);
  Prog* prog = re->CompileToProg(0);
  CHECK(prog);
  for (int i = 0; i < iters; i++) {
    CHECK_EQ(prog->SearchNFA(text, NULL, anchor, Prog::kFirstMatch, NULL, 0),
             expect_match);
  }
  delete prog;
  re->Decref();
}